

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::runTest
               (TestLog *log,ResultCollector *results,RenderContext *renderContext,
               BlendState *preCommonBlendState,BlendState *postCommonBlendState,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers)

{
  BlendState *state;
  ostringstream *this;
  ostringstream *poVar1;
  float *pfVar2;
  GLenum *pGVar3;
  char cVar4;
  TestLog *pTVar5;
  _Alloc_hider imageSetName;
  undefined8 imageSetDesc;
  pointer pTVar6;
  pointer pTVar7;
  ScopedLogSection SVar8;
  _func_int **pp_Var9;
  bool bVar10;
  int i;
  int iVar11;
  deUint32 dVar12;
  int iVar13;
  TextureChannelClass TVar14;
  ContextType CVar15;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  undefined4 extraout_var_00;
  mapped_type *pmVar17;
  ostream *poVar18;
  ProgramSources *pPVar19;
  glDisableiFunc *pp_Var20;
  bool *pbVar21;
  undefined4 extraout_var_01;
  int iVar22;
  BlendMode BVar23;
  ulong uVar24;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *pvVar25;
  pointer pDVar26;
  int drawBufferNdx;
  GLuint GVar27;
  ulong uVar28;
  char *pcVar29;
  FragmentShader *this_01;
  long lVar30;
  GLenum GVar31;
  TextureLevel *pTVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  int local_694;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *local_690;
  long local_688;
  TestLog *local_680;
  BlendState *local_678;
  BlendState *local_670;
  RenderContext *local_668;
  ProgramSources *local_660;
  string name_1;
  ScopedLogSection drawBufferSection;
  undefined1 local_620 [24];
  _Base_ptr local_608;
  pointer local_600;
  Program program_1;
  VertexAttrib vertexAttribs [1];
  TextureFormat format;
  UVec4 threshold_1;
  IVec2 size;
  unsigned_long local_558;
  PrimitiveList primitives;
  Renderer renderer;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> refRenderbuffers;
  ScopedLogSection drawBuffersSection;
  FragmentShader fragmentShader;
  Framebuffer framebuffer;
  TextureFormat local_3b0;
  TextureFormatInfo info;
  RenderState renderState;
  RenderbufferVector renderbuffers;
  ScopedLogSection s;
  GLuint local_80;
  Vec4 threshold;
  Functions *pFVar16;
  
  local_680 = log;
  local_678 = preCommonBlendState;
  local_670 = postCommonBlendState;
  local_668 = renderContext;
  iVar11 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  pFVar16 = (Functions *)CONCAT44(extraout_var,iVar11);
  glu::TypedObjectVector<(glu::ObjectType)2>::TypedObjectVector
            (&renderbuffers,pFVar16,
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 7);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&framebuffer,pFVar16);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            (&refRenderbuffers,
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 7,(allocator_type *)&info);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info,"DrawBuffers",(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&renderState,"Draw buffers",(allocator<char> *)&fragmentShader);
  local_690 = drawBuffers;
  tcu::ScopedLogSection::ScopedLogSection
            (&drawBuffersSection,local_680,(string *)&info,(string *)&renderState);
  std::__cxx11::string::~string((string *)&renderState);
  std::__cxx11::string::~string((string *)&info);
  this = (ostringstream *)(info.valueMin.m_data + 2);
  iVar11 = 0;
  while( true ) {
    name_1._M_dataplus._M_p._0_4_ = iVar11;
    if ((int)((ulong)((long)(local_690->
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_690->
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 7) <= iVar11) break;
    de::toString<int>((string *)&renderState,(int *)&name_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                   "DrawBuffer",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&renderState
                  );
    de::toString<int>((string *)&fragmentShader,(int *)&name_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   "Draw Buffer ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fragmentShader);
    pTVar5 = local_680;
    tcu::ScopedLogSection::ScopedLogSection
              (&drawBufferSection,local_680,(string *)&info,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&fragmentShader);
    std::__cxx11::string::~string((string *)&info);
    std::__cxx11::string::~string((string *)&renderState);
    pDVar26 = (local_690->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_start + (int)name_1._M_dataplus._M_p;
    info.valueMin.m_data._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Format: ");
    this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)&info,&pDVar26->m_format);
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    info.valueMin.m_data._0_8_ = local_680;
    poVar1 = (ostringstream *)(info.valueMin.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Size: ");
    tcu::operator<<((ostream *)poVar1,&pDVar26->m_size);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&info,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    info.valueMin.m_data._0_8_ = local_680;
    poVar1 = (ostringstream *)(info.valueMin.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Render: ");
    pcVar29 = "false";
    if (pDVar26->m_render != false) {
      pcVar29 = "true";
    }
    std::operator<<((ostream *)poVar1,pcVar29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&info,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::ScopedLogSection::~ScopedLogSection(&drawBufferSection);
    iVar11 = (int)name_1._M_dataplus._M_p + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&drawBuffersSection);
  bVar10 = BlendState::isEmpty(local_678);
  if (!bVar10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&info,"PreCommonState",(allocator<char> *)&fragmentShader);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"First set common blend state",
               (allocator<char> *)&drawBuffersSection);
    pTVar5 = local_680;
    tcu::ScopedLogSection::ScopedLogSection(&s,local_680,(string *)&info,(string *)&renderState);
    std::__cxx11::string::~string((string *)&renderState);
    std::__cxx11::string::~string((string *)&info);
    logBlendState(pTVar5,local_678);
    tcu::ScopedLogSection::~ScopedLogSection(&s);
  }
  iVar11 = 0;
  while( true ) {
    name_1._M_dataplus._M_p._0_4_ = iVar11;
    pDVar26 = (local_690->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar28 = (long)(local_690->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar26;
    if ((int)(uVar28 >> 7) <= iVar11) break;
    bVar10 = BlendState::isEmpty(&pDVar26[iVar11].m_blendState);
    if (!bVar10) {
      de::toString<int>((string *)&renderState,(int *)&name_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                     "DrawBufferState",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &renderState);
      de::toString<int>((string *)&drawBuffersSection,(int *)&name_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fragmentShader,"Set DrawBuffer ",(string *)&drawBuffersSection);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fragmentShader," state to");
      pTVar5 = local_680;
      tcu::ScopedLogSection::ScopedLogSection
                (&drawBufferSection,local_680,(string *)&info,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)&fragmentShader);
      std::__cxx11::string::~string((string *)&drawBuffersSection);
      std::__cxx11::string::~string((string *)&info);
      std::__cxx11::string::~string((string *)&renderState);
      logBlendState(pTVar5,&(local_690->
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                            )._M_impl.super__Vector_impl_data._M_start[(int)name_1._M_dataplus._M_p]
                            .m_blendState);
      tcu::ScopedLogSection::~ScopedLogSection(&drawBufferSection);
      iVar11 = (int)name_1._M_dataplus._M_p;
    }
    iVar11 = iVar11 + 1;
  }
  bVar10 = BlendState::isEmpty(local_670);
  pvVar25 = local_690;
  if (!bVar10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&info,"PostCommonState",(allocator<char> *)&fragmentShader);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"After set common blend state",
               (allocator<char> *)&drawBuffersSection);
    pTVar5 = local_680;
    tcu::ScopedLogSection::ScopedLogSection(&s,local_680,(string *)&info,(string *)&renderState);
    std::__cxx11::string::~string((string *)&renderState);
    std::__cxx11::string::~string((string *)&info);
    logBlendState(pTVar5,local_670);
    tcu::ScopedLogSection::~ScopedLogSection(&s);
    uVar28 = (long)(pvVar25->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar25->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  }
  s.m_log = (TestLog *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s,(long)uVar28 >> 7);
  (*pFVar16->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  lVar30 = 0xc;
  local_688 = 0;
  for (lVar34 = 0;
      pDVar26 = (pvVar25->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start,
      lVar34 < (int)((ulong)((long)(pvVar25->
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar26) >> 7
                    ); lVar34 = lVar34 + 1) {
    dVar12 = glu::getInternalFormat
                       (*(TextureFormat *)((long)(pDVar26->m_size).m_data + lVar30 + -4));
    GVar31 = (int)lVar34 + 0x8ce0;
    *(GLenum *)((long)&(s.m_log)->m_log + lVar34 * 4) = GVar31;
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)&info,(TextureFormat *)((long)(pDVar26->m_size).m_data + lVar30 + -4)
               ,*(int *)((long)(&pDVar26->m_size + -2) + 4 + lVar30),
               *(int *)((long)(&pDVar26->m_size + -1) + lVar30),1);
    tcu::TextureLevel::operator=
              ((TextureLevel *)
               ((long)((refRenderbuffers.
                        super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                        _M_impl.super__Vector_impl_data._M_start)->m_size).m_data + local_688 + -8),
               (TextureLevel *)&info);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&info);
    (*pFVar16->bindRenderbuffer)
              (0x8d41,renderbuffers.super_ObjectVector.m_objects.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar34]);
    (*pFVar16->renderbufferStorage)
              (0x8d41,dVar12,*(GLsizei *)((long)(&pDVar26->m_size + -2) + 4 + lVar30),
               *(GLsizei *)((long)(&pDVar26->m_size + -1) + lVar30));
    (*pFVar16->framebufferRenderbuffer)
              (0x8d40,GVar31,0x8d41,
               renderbuffers.super_ObjectVector.m_objects.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar34]);
    GVar31 = (*pFVar16->getError)();
    glu::checkError(GVar31,"Failed to create renderbuffer.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                    ,0x1a2);
    local_688 = local_688 + 0x28;
    lVar30 = lVar30 + 0x80;
    pvVar25 = local_690;
  }
  (*pFVar16->drawBuffers)((GLsizei)((ulong)-(long)s.m_log >> 2),(GLenum *)s.m_log);
  local_558 = 0;
  lVar30 = 0xc;
  local_660 = (ProgramSources *)0x0;
  lVar34 = 0;
  while (pTVar7 = refRenderbuffers.
                  super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        pTVar6 = refRenderbuffers.
                 super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
                 super__Vector_impl_data._M_start,
        pDVar26 = (pvVar25->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        lVar34 < (int)((ulong)((long)(pvVar25->
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar26) >>
                      7)) {
    local_688 = lVar34;
    tcu::getTextureFormatInfo(&info,(TextureFormat *)((long)(pDVar26->m_size).m_data + lVar30 + -4))
    ;
    uVar28 = ((long)pTVar7 - (long)pTVar6) / 0x28;
    iVar11 = (int)uVar28;
    iVar33 = (int)local_660 + iVar11;
    iVar13 = (int)local_688;
    iVar22 = (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) / 2);
    TVar14 = tcu::getTextureChannelClass(*(ChannelType *)((long)(pDVar26->m_size).m_data + lVar30));
    if (TVar14 < TEXTURECHANNELCLASS_LAST) {
      fVar41 = (float)iVar11;
      pTVar32 = (TextureLevel *)((long)(pTVar6->m_size).m_data + (local_558 - 8));
      auVar36._0_4_ = (float)((int)local_688 + 1);
      auVar36._4_4_ = (float)((iVar13 + iVar22) % iVar11);
      auVar36._8_4_ = (float)iVar33;
      auVar36._12_4_ = (float)((iVar22 + iVar33) % iVar11 + 1);
      auVar37._4_4_ = fVar41;
      auVar37._0_4_ = fVar41;
      auVar37._8_4_ = fVar41;
      auVar37._12_4_ = fVar41;
      auVar37 = divps(auVar36,auVar37);
      fVar41 = auVar37._0_4_;
      fVar38 = auVar37._4_4_;
      fVar39 = auVar37._8_4_;
      fVar40 = auVar37._12_4_;
      switch(TVar14) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (info.valueMax.m_data[2] - info.valueMin.m_data[2]) * fVar39 + info.valueMin.m_data[2];
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ =
             (info.valueMax.m_data[3] - info.valueMin.m_data[3]) * fVar40 + info.valueMin.m_data[3];
        fragmentShader.super_FragmentShader._vptr_FragmentShader =
             (_func_int **)
             CONCAT44((info.valueMax.m_data[1] - info.valueMin.m_data[1]) * fVar38 +
                      info.valueMin.m_data[1],
                      (info.valueMax.m_data[0] - info.valueMin.m_data[0]) * fVar41 +
                      info.valueMin.m_data[0]);
        tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&renderState,pTVar32);
        tcu::clear((PixelBufferAccess *)&renderState,(Vec4 *)&fragmentShader);
        (*pFVar16->clearBufferfv)(0x1800,(GLint)local_688,(GLfloat *)&fragmentShader);
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = fVar39 * info.valueMax.m_data[2];
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = fVar40 * info.valueMax.m_data[3];
        fragmentShader.super_FragmentShader._vptr_FragmentShader =
             (_func_int **)
             CONCAT44(fVar38 * info.valueMax.m_data[1],fVar41 * info.valueMax.m_data[0]);
        tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&renderState,pTVar32);
        tcu::clear((PixelBufferAccess *)&renderState,(Vec4 *)&fragmentShader);
        (*pFVar16->clearBufferfv)(0x1800,(GLint)local_688,(GLfloat *)&fragmentShader);
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (float)(int)((info.valueMax.m_data[2] - info.valueMin.m_data[2]) * fVar39 +
                         info.valueMin.m_data[2]);
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ =
             (float)(int)((info.valueMax.m_data[3] - info.valueMin.m_data[3]) * fVar40 +
                         info.valueMin.m_data[3]);
        fragmentShader.super_FragmentShader._vptr_FragmentShader =
             (_func_int **)
             CONCAT44((int)((info.valueMax.m_data[1] - info.valueMin.m_data[1]) * fVar38 +
                           info.valueMin.m_data[1]),
                      (int)((info.valueMax.m_data[0] - info.valueMin.m_data[0]) * fVar41 +
                           info.valueMin.m_data[0]));
        tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&renderState,pTVar32);
        tcu::clear((PixelBufferAccess *)&renderState,(IVec4 *)&fragmentShader);
        (*pFVar16->clearBufferiv)(0x1800,(GLint)local_688,(GLint *)&fragmentShader);
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        uVar42 = (uint)(fVar41 * info.valueMax.m_data[0]);
        uVar43 = (uint)(fVar38 * info.valueMax.m_data[1]);
        uVar44 = (uint)(fVar39 * info.valueMax.m_data[2]);
        uVar45 = (uint)(fVar40 * info.valueMax.m_data[3]);
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (float)((int)(fVar39 * info.valueMax.m_data[2] - 2.1474836e+09) & (int)uVar44 >> 0x1f |
                    uVar44);
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ =
             (float)((int)(fVar40 * info.valueMax.m_data[3] - 2.1474836e+09) & (int)uVar45 >> 0x1f |
                    uVar45);
        fragmentShader.super_FragmentShader._vptr_FragmentShader =
             (_func_int **)
             CONCAT44((int)(fVar38 * info.valueMax.m_data[1] - 2.1474836e+09) & (int)uVar43 >> 0x1f
                      | uVar43,(int)(fVar41 * info.valueMax.m_data[0] - 2.1474836e+09) &
                               (int)uVar42 >> 0x1f | uVar42);
        tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&renderState,pTVar32);
        tcu::clear((PixelBufferAccess *)&renderState,(UVec4 *)&fragmentShader);
        (*pFVar16->clearBufferuiv)(0x1800,(GLint)local_688,(GLuint *)&fragmentShader);
        break;
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = fVar39 * 2000.0 + -1000.0;
        fragmentShader.super_FragmentShader.m_inputs.
        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = fVar40 * 2000.0 + -1000.0;
        fragmentShader.super_FragmentShader._vptr_FragmentShader =
             (_func_int **)CONCAT44(fVar38 * 2000.0 + -1000.0,fVar41 * 2000.0 + -1000.0);
        tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&renderState,pTVar32);
        tcu::clear((PixelBufferAccess *)&renderState,(Vec4 *)&fragmentShader);
        (*pFVar16->clearBufferfv)(0x1800,(GLint)local_688,(GLfloat *)&fragmentShader);
      }
    }
    GVar31 = (*pFVar16->getError)();
    glu::checkError(GVar31,"Failed to clear renderbuffer.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                    ,0x183);
    local_660 = (ProgramSources *)(ulong)((int)local_660 - 1);
    local_558 = local_558 + 0x28;
    lVar30 = lVar30 + 0x80;
    pvVar25 = local_690;
    lVar34 = local_688 + 1;
  }
  (*pFVar16->bindRenderbuffer)(0x8d41,0);
  (*pFVar16->bindFramebuffer)(0x8d40,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
  iVar11 = (*local_668->_vptr_RenderContext[3])();
  pFVar16 = (Functions *)CONCAT44(extraout_var_00,iVar11);
  pfVar2 = info.valueMin.m_data + 2;
  memset(&renderState,0,0xac);
  renderState.fragOps.colorMask.m_data[0] = false;
  renderState.fragOps.colorMask.m_data[1] = false;
  renderState.fragOps.colorMask.m_data[2] = false;
  renderState.fragOps.colorMask.m_data[3] = false;
  renderState.fragOps.numStencilBits = 0;
  renderState.point.pointSize._0_1_ = 0;
  renderState._185_7_ = 0;
  renderState.viewport.rect.bottom._0_1_ = 0;
  renderState.viewport.rect._5_8_ = 0;
  CVar15.super_ApiType.m_bits = (ApiType)(*local_668->_vptr_RenderContext[2])();
  bVar10 = glu::contextSupports(CVar15,(ApiType)0x23);
  info.valueMin.m_data._8_8_ = (ulong)(uint)info.valueMin.m_data[3] << 0x20;
  info.valueMax.m_data[0] = 0.0;
  info.valueMax.m_data[1] = 0.0;
  info.lookupScale.m_data[2] = 0.0;
  info.lookupScale.m_data[3] = 0.0;
  info.valueMax.m_data._8_8_ = pfVar2;
  info.lookupScale.m_data._0_8_ = pfVar2;
  glu::getGLSLVersionDeclaration(bVar10 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&drawBuffersSection,"GLSL_VERSION_DECL",(allocator<char> *)&drawBufferSection
            );
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&info,(key_type *)&drawBuffersSection);
  std::__cxx11::string::assign((char *)pmVar17);
  std::__cxx11::string::~string((string *)&drawBuffersSection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)vertexAttribs,
             "${GLSL_VERSION_DECL}\nlayout(location=0) in highp vec2 i_coord;\nout highp vec2 v_color;\nvoid main (void)\n{\n\tv_color = 0.5 * (vec2(1.0) + i_coord);\n\tgl_Position = vec4(i_coord, 0.0, 1.0);\n}"
             ,(allocator<char> *)&program_1);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&drawBufferSection,(string *)vertexAttribs);
  tcu::StringTemplate::specialize
            ((string *)&drawBuffersSection,(StringTemplate *)&drawBufferSection,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&info);
  glu::VertexSource::VertexSource((VertexSource *)&name_1,(string *)&drawBuffersSection);
  std::__cxx11::string::~string((string *)&drawBuffersSection);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&drawBufferSection);
  std::__cxx11::string::~string((string *)vertexAttribs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&info);
  local_660 = glu::ProgramSources::operator<<
                        ((ProgramSources *)&renderState,(ShaderSource *)&name_1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&info);
  CVar15.super_ApiType.m_bits = (ApiType)(*local_668->_vptr_RenderContext[2])();
  bVar10 = glu::contextSupports(CVar15,(ApiType)0x23);
  local_688 = CONCAT71(local_688._1_7_,bVar10);
  std::operator<<((ostream *)&info,"${GLSL_VERSION_DECL}\n");
  BlendState::BlendState((BlendState *)&drawBuffersSection,local_670);
  bVar10 = requiresAdvancedBlendEq(local_678,(BlendState *)&drawBuffersSection,pvVar25);
  BlendState::~BlendState((BlendState *)&drawBuffersSection);
  if (bVar10) {
    poVar18 = std::operator<<((ostream *)&info,"${GLSL_EXTENSION}");
    std::operator<<(poVar18,"layout(blend_support_all_equations) out;\n");
  }
  std::operator<<((ostream *)&info,"in highp vec2 v_color;\n");
  lVar30 = 0x10;
  for (lVar34 = 0;
      pDVar26 = (local_690->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start,
      lVar34 < (int)((ulong)((long)(local_690->
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar26) >> 7
                    ); lVar34 = lVar34 + 1) {
    poVar18 = std::operator<<((ostream *)&info,"layout(location=");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)lVar34);
    std::operator<<(poVar18,") out highp ");
    TVar14 = tcu::getTextureChannelClass
                       (*(ChannelType *)((long)(pDVar26->m_size).m_data + lVar30 + -4));
    if (TVar14 < TEXTURECHANNELCLASS_LAST) {
      std::operator<<((ostream *)&info,&DAT_018d9708 + *(int *)(&DAT_018d9708 + (ulong)TVar14 * 4));
    }
    poVar18 = std::operator<<((ostream *)&info," o_drawBuffer");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)lVar34);
    std::operator<<(poVar18,";\n");
    lVar30 = lVar30 + 0x80;
  }
  poVar18 = std::operator<<((ostream *)&info,"void main (void)\n");
  std::operator<<(poVar18,"{\n");
  lVar30 = 0;
  while (pDVar26 = (local_690->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start,
        lVar30 < (int)((ulong)((long)(local_690->
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar26) >>
                      7)) {
    poVar18 = std::operator<<((ostream *)&info,"\to_drawBuffer");
    uVar42 = (uint)lVar30;
    std::ostream::operator<<(poVar18,uVar42);
    TVar14 = tcu::getTextureChannelClass(pDVar26[lVar30].m_format.type);
    switch(TVar14) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      poVar18 = std::operator<<((ostream *)&info," = vec4(");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)[uVar42 & 3]);
      poVar18 = std::operator<<(poVar18,", ");
      lVar30 = lVar30 + 1;
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)[(uint)lVar30 & 3]);
      poVar18 = std::operator<<(poVar18,", ");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)
                                        [(int)(uVar42 + 2) % 4]);
      poVar18 = std::operator<<(poVar18,", ");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)
                                        [(int)(uVar42 + 3) % 4]);
      std::operator<<(poVar18,");\n");
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      poVar18 = std::operator<<((ostream *)&info," = ivec4(int(");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)[uVar42 & 3]);
      poVar18 = std::operator<<(poVar18,"), int(");
      lVar30 = lVar30 + 1;
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)[(uint)lVar30 & 3]);
      poVar18 = std::operator<<(poVar18,"), int(");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)
                                        [(int)(uVar42 + 2) % 4]);
      poVar18 = std::operator<<(poVar18,"), int(");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)
                                        [(int)(uVar42 + 3) % 4]);
      std::operator<<(poVar18,"));\n");
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      poVar18 = std::operator<<((ostream *)&info," = uvec4(uint(");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)[uVar42 & 3]);
      poVar18 = std::operator<<(poVar18,"), uint(");
      lVar30 = lVar30 + 1;
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)[(uint)lVar30 & 3]);
      poVar18 = std::operator<<(poVar18,"), uint(");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)
                                        [(int)(uVar42 + 2) % 4]);
      poVar18 = std::operator<<(poVar18,"), uint(");
      poVar18 = std::operator<<(poVar18,(&PTR_anon_var_dwarf_26d077b_01e59a20)
                                        [(int)(uVar42 + 3) % 4]);
      std::operator<<(poVar18,"));\n");
      break;
    default:
      lVar30 = lVar30 + 1;
    }
  }
  std::operator<<((ostream *)&info,"}");
  pvVar25 = local_690;
  local_620._16_8_ = local_620;
  local_620._0_4_ = _S_red;
  local_620._8_8_ = 0;
  local_600 = (pointer)0x0;
  local_608 = (_Base_ptr)local_620._16_8_;
  glu::getGLSLVersionDeclaration((byte)local_688 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_1,"GLSL_VERSION_DECL",(allocator<char> *)&primitives);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&drawBufferSection,(key_type *)&program_1);
  std::__cxx11::string::assign((char *)pmVar17);
  std::__cxx11::string::~string((string *)&program_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_1,"GLSL_EXTENSION",(allocator<char> *)&primitives);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&drawBufferSection,(key_type *)&program_1);
  std::__cxx11::string::assign((char *)pmVar17);
  std::__cxx11::string::~string((string *)&program_1);
  std::__cxx11::stringbuf::str();
  tcu::StringTemplate::StringTemplate((StringTemplate *)&primitives,(string *)&threshold_1);
  tcu::StringTemplate::specialize
            ((string *)&program_1,(StringTemplate *)&primitives,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&drawBufferSection);
  glu::FragmentSource::FragmentSource((FragmentSource *)vertexAttribs,(string *)&program_1);
  std::__cxx11::string::~string((string *)&program_1);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&primitives);
  std::__cxx11::string::~string((string *)&threshold_1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&drawBufferSection);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&info);
  pPVar19 = glu::ProgramSources::operator<<(local_660,(ShaderSource *)vertexAttribs);
  glu::ProgramSources::ProgramSources((ProgramSources *)&fragmentShader,pPVar19);
  std::__cxx11::string::~string((string *)&vertexAttribs[0].stride);
  std::__cxx11::string::~string((string *)&name_1._M_string_length);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&renderState);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&s,pFVar16,(ProgramSources *)&fragmentShader);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&fragmentShader);
  tcu::Vector<int,_2>::Vector
            (&size,&((pvVar25->
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start)->m_size);
  BlendState::BlendState((BlendState *)&drawBuffersSection,local_670);
  bVar10 = requiresAdvancedBlendEq(local_678,(BlendState *)&drawBuffersSection,pvVar25);
  BlendState::~BlendState((BlendState *)&drawBuffersSection);
  threshold_1.m_data[0] = 0;
  threshold_1.m_data[1] = 0;
  threshold_1.m_data[2] = 0;
  threshold_1.m_data[3] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&threshold_1,
             (long)(pvVar25->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar25->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 7);
  uVar24 = (ulong)(threshold_1.m_data._8_8_ - threshold_1.m_data._0_8_) >> 2;
  pDVar26 = (pvVar25->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar28 = uVar24 & 0xffffffff;
  if ((int)uVar24 < 1) {
    uVar28 = 0;
  }
  for (uVar24 = 0; uVar28 != uVar24; uVar24 = uVar24 + 1) {
    iVar11 = (int)uVar24 + 0x8ce0;
    if (pDVar26->m_render == false) {
      iVar11 = 0;
    }
    *(int *)(threshold_1.m_data._0_8_ + uVar24 * 4) = iVar11;
    pDVar26 = pDVar26 + 1;
  }
  glu::operator<<(local_680,(ShaderProgram *)&s);
  (*pFVar16->viewport)(0,0,size.m_data[0],size.m_data[1]);
  (*pFVar16->useProgram)(local_80);
  (*pFVar16->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  setCommonBlendState(pFVar16,local_678);
  local_688 = CONCAT71(local_688._1_7_,bVar10);
  lVar30 = 0x18;
  lVar34 = 0;
  while( true ) {
    pDVar26 = (local_690->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(local_690->
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar26) >> 7) <=
        lVar34) break;
    pcVar29 = *(char **)((long)(pDVar26->m_size).m_data + lVar30 + -4);
    GVar27 = (GLuint)lVar34;
    if (pcVar29 != (char *)0x0) {
      pp_Var20 = &pFVar16->disablei;
      if (*pcVar29 != '\0') {
        pp_Var20 = &pFVar16->enablei;
      }
      (**pp_Var20)(0xbe2,GVar27);
    }
    if (*(Vector<bool,_4> **)((long)(&pDVar26->m_size + 10) + lVar30 + 4) != (Vector<bool,_4> *)0x0)
    {
      tcu::Vector<bool,_4>::Vector
                ((Vector<bool,_4> *)&info,
                 *(Vector<bool,_4> **)((long)(&pDVar26->m_size + 10) + lVar30 + 4));
      (*pFVar16->colorMaski)
                (GVar27,info.valueMin.m_data[0]._0_1_,info.valueMin.m_data[0]._1_1_,
                 info.valueMin.m_data[0]._2_1_,info.valueMin.m_data[0]._3_1_);
    }
    pcVar29 = *(char **)((long)&((TextureFormat *)(&pDVar26->m_size + 1))->type + lVar30);
    if (pcVar29 != (char *)0x0) {
      GVar31 = **(GLenum **)(pcVar29 + 8);
      if (*pcVar29 == '\x01') {
        (*pFVar16->blendEquationi)(GVar27,GVar31);
      }
      else {
        (*pFVar16->blendEquationSeparatei)(GVar27,GVar31,(*(GLenum **)(pcVar29 + 8))[1]);
      }
    }
    pcVar29 = *(char **)((long)(&pDVar26->m_size + 5) + lVar30 + 4);
    if (pcVar29 != (char *)0x0) {
      pGVar3 = *(GLenum **)(pcVar29 + 8);
      if (*pcVar29 == '\x01') {
        (*pFVar16->blendFunci)(GVar27,*pGVar3,pGVar3[1]);
      }
      else {
        (*pFVar16->blendFuncSeparatei)(GVar27,*pGVar3,pGVar3[1],pGVar3[2],pGVar3[3]);
      }
    }
    GVar31 = (*pFVar16->getError)();
    glu::checkError(GVar31,"Failed to set draw buffer specifig blend state.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                    ,0x10e);
    lVar34 = lVar34 + 1;
    lVar30 = lVar30 + 0x80;
  }
  setCommonBlendState(pFVar16,local_670);
  cVar4 = (byte)local_688;
  (*pFVar16->drawBuffers)
            ((GLsizei)((ulong)(threshold_1.m_data._8_8_ - threshold_1.m_data._0_8_) >> 2),
             (GLenum *)threshold_1.m_data._0_8_);
  if (cVar4 != '\0') {
    (*pFVar16->blendBarrier)();
  }
  renderState._0_8_ = (ulong)renderState.provokingVertexConvention << 0x20;
  renderState.rasterization._0_8_ = &renderState.fragOps;
  renderState.rasterization.verticalFill = FILL_TOP;
  renderState.rasterization.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  renderState.fragOps.scissorTestEnabled = false;
  renderState.fragOps.scissorRectangle.height = 0;
  glu::BindingPoint::BindingPoint((BindingPoint *)&info,(BindingPoint *)&renderState);
  info.lookupBias.m_data[0] = 1.12104e-44;
  info.lookupBias.m_data[1] = 0.0;
  info.lookupBias.m_data[2] = 2.8026e-45;
  info.lookupBias.m_data[3] = 8.40779e-45;
  std::__cxx11::string::~string((string *)&renderState.rasterization);
  renderState.cullMode = CULLMODE_NONE;
  renderState.provokingVertexConvention = 6;
  renderState.rasterization.winding = WINDING_LAST|WINDING_CW;
  renderState.rasterization.verticalFill = FILL_TOP;
  renderState.rasterization.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  glu::draw(local_668,local_80,1,(VertexArrayBinding *)&info,(PrimitiveList *)&renderState,
            (DrawUtilCallback *)0x0);
  std::__cxx11::string::~string((string *)(info.valueMin.m_data + 2));
  if (cVar4 != '\0') {
    (*pFVar16->blendBarrier)();
  }
  (*pFVar16->drawBuffers)(0,(GLenum *)0x0);
  (*pFVar16->bindFramebuffer)(0x8d40,0);
  (*pFVar16->useProgram)(0);
  GVar31 = (*pFVar16->getError)();
  glu::checkError(GVar31,"Failed to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0x414);
  rr::Renderer::Renderer(&renderer);
  rr::PrimitiveList::PrimitiveList(&primitives,PRIMITIVETYPE_TRIANGLES,6,0);
  vertexAttribs[0].generic.v._8_8_ = 0;
  vertexAttribs[0].stride = 0;
  vertexAttribs[0].instanceDivisor = 0;
  vertexAttribs[0].generic.v._0_8_ = 0;
  vertexAttribs[0].type = VERTEXATTRIBTYPE_FLOAT;
  vertexAttribs[0].size = 2;
  vertexAttribs[0].pointer = Functional::(anonymous_namespace)::s_quadCoords;
  lVar30 = 0x18;
  lVar34 = 0;
  for (lVar35 = 0;
      pDVar26 = (local_690->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start,
      lVar35 < (int)((ulong)((long)(local_690->
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar26) >> 7
                    ); lVar35 = lVar35 + 1) {
    if (*(char *)((long)(&pDVar26->m_size + -4) + 4 + lVar30) == '\x01') {
      tcu::Vector<int,_2>::Vector
                ((Vector<int,_2> *)&fragmentShader,
                 (Vector<int,_2> *)((long)(&pDVar26->m_size + -3) + lVar30));
      info.valueMin.m_data[0] = 0.0;
      info.valueMin.m_data[1] = 0.0;
      info.valueMin.m_data._8_8_ = fragmentShader.super_FragmentShader._vptr_FragmentShader;
      info.valueMax.m_data[0] = 0.0;
      info.valueMax.m_data[1] = 1.0;
      rr::RenderState::RenderState
                (&renderState,(ViewportState *)&info,VIEWPORTORIENTATION_LOWER_LEFT);
      renderState.fragOps.blendMode = BLENDMODE_STANDARD;
      setBlendState(&renderState.fragOps,local_678);
      state = (BlendState *)((long)(pDVar26->m_size).m_data + lVar30 + -4);
      setBlendState(&renderState.fragOps,state);
      setBlendState(&renderState.fragOps,local_670);
      pbVar21 = (local_670->enableBlend).m_ptr;
      if (((pbVar21 == (bool *)0x0) &&
          (pbVar21 = (state->enableBlend).m_ptr, pbVar21 == (bool *)0x0)) &&
         (pbVar21 = (local_678->enableBlend).m_ptr, pbVar21 == (bool *)0x0)) {
        BVar23 = BLENDMODE_NONE;
      }
      else {
        BVar23 = BLENDMODE_NONE;
        if (*pbVar21 != false) {
          BVar23 = renderState.fragOps.blendMode;
        }
      }
      renderState.fragOps.blendMode = BVar23;
      TVar14 = tcu::getTextureChannelClass
                         (*(ChannelType *)((long)(&pDVar26->m_size + -2) + 4 + lVar30));
      if (((TVar14 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) &&
          (TVar14 = tcu::getTextureChannelClass
                              (*(ChannelType *)((long)(&pDVar26->m_size + -2) + 4 + lVar30)),
          TVar14 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) &&
         (TVar14 = tcu::getTextureChannelClass
                             (*(ChannelType *)((long)(&pDVar26->m_size + -2) + 4 + lVar30)),
         TVar14 != TEXTURECHANNELCLASS_FLOATING_POINT)) {
        renderState.fragOps.blendMode = BLENDMODE_NONE;
      }
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&drawBufferSection,
                 (TextureLevel *)
                 ((long)((refRenderbuffers.
                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar34 + -8));
      rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
                ((MultisamplePixelBufferAccess *)&fragmentShader,
                 (PixelBufferAccess *)&drawBufferSection);
      rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
                ((MultisamplePixelBufferAccess *)&name_1);
      rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
                ((MultisamplePixelBufferAccess *)&program_1);
      rr::RenderTarget::RenderTarget
                ((RenderTarget *)&info,(MultisamplePixelBufferAccess *)&fragmentShader,
                 (MultisamplePixelBufferAccess *)&name_1,(MultisamplePixelBufferAccess *)&program_1)
      ;
      rr::VertexShader::VertexShader((VertexShader *)&drawBufferSection,1,1);
      drawBufferSection.m_log = (TestLog *)&PTR_shadeVertices_01e59a50;
      *(undefined4 *)CONCAT44(local_620._4_4_,local_620._0_4_) = 0;
      local_608->_M_color = _S_red;
      pDVar26 = (local_690->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      rr::FragmentShader::FragmentShader(&fragmentShader.super_FragmentShader,1,1);
      fragmentShader.super_FragmentShader._vptr_FragmentShader =
           (_func_int **)&PTR_shadeFragments_01e59a80;
      fragmentShader.m_drawBufferNdx = (int)lVar35;
      DrawBufferInfo::DrawBufferInfo
                (&fragmentShader.m_info,
                 (DrawBufferInfo *)((long)(&pDVar26->m_size + -4) + 4 + lVar30));
      *(undefined4 *)
       CONCAT44(fragmentShader.super_FragmentShader.m_inputs.
                super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                _M_impl.super__Vector_impl_data._M_start._4_4_,
                fragmentShader.super_FragmentShader.m_inputs.
                super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                _M_impl.super__Vector_impl_data._M_start._0_4_) = 0;
      TVar14 = tcu::getTextureChannelClass(fragmentShader.m_info.m_format.type);
      name_1.field_2._M_allocated_capacity = (size_type)&program_1;
      if (TVar14 < TEXTURECHANNELCLASS_LAST) {
        (fragmentShader.super_FragmentShader.m_outputs.
         super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl
         .super__Vector_impl_data._M_start)->type =
             *(GenericVecType *)(&DAT_018d971c + (ulong)TVar14 * 4);
      }
      program_1.geometryShader = (GeometryShader *)0x0;
      name_1._M_dataplus._M_p = (pointer)&renderState;
      name_1._M_string_length = (size_type)&info;
      name_1.field_2._8_4_ = 1;
      program_1.vertexShader = (VertexShader *)&drawBufferSection;
      program_1.fragmentShader = &fragmentShader.super_FragmentShader;
      rr::Renderer::draw(&renderer,(DrawCommand *)&name_1);
      FragmentShader::~FragmentShader(&fragmentShader);
      rr::VertexShader::~VertexShader((VertexShader *)&drawBufferSection);
    }
    lVar30 = lVar30 + 0x80;
    lVar34 = lVar34 + 0x28;
  }
  rr::Renderer::~Renderer(&renderer);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&threshold_1);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&s);
  iVar11 = (*local_668->_vptr_RenderContext[3])();
  lVar30 = CONCAT44(extraout_var_01,iVar11);
  (**(code **)(lVar30 + 0x78))(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  pvVar25 = (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
             *)0x0;
  do {
    pTVar6 = refRenderbuffers.
             super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(int)((ulong)((long)renderbuffers.super_ObjectVector.m_objects.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)renderbuffers.super_ObjectVector.m_objects.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) <= (long)pvVar25) {
      (**(code **)(lVar30 + 0x78))(0x8d40,0);
      std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector(&refRenderbuffers)
      ;
      glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
      glu::ObjectVector::~ObjectVector(&renderbuffers.super_ObjectVector);
      return;
    }
    iVar11 = refRenderbuffers.
             super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pvVar25].m_size.m_data[0];
    iVar13 = refRenderbuffers.
             super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pvVar25].m_size.m_data[1];
    format = refRenderbuffers.
             super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pvVar25].m_format;
    local_690 = pvVar25;
    TVar14 = tcu::getTextureChannelClass(format.type);
    info.valueMin.m_data[0] = 1.12104e-44;
    info.valueMin.m_data[1] = 4.2039e-45;
    if (TVar14 < TEXTURECHANNELCLASS_LAST) {
      info.valueMin.m_data._0_8_ = *(undefined8 *)(&DAT_018d9730 + (ulong)TVar14 * 8);
    }
    tcu::TextureLevel::TextureLevel((TextureLevel *)&s,(TextureFormat *)&info,iVar11,iVar13,1);
    (**(code **)(lVar30 + 0x1218))((int)local_690 + 0x8ce0);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&info,(TextureLevel *)&s);
    glu::readPixels(local_668,0,0,(PixelBufferAccess *)&info);
    dVar12 = (**(code **)(lVar30 + 0x800))();
    glu::checkError(dVar12,"Reading pixels from renderbuffer failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                    ,0x234);
    local_694 = (int)local_690;
    TVar14 = tcu::getTextureChannelClass(format.type);
    pTVar32 = pTVar6 + (long)pvVar25;
    if (TVar14 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      de::toString<int>((string *)&info,&local_694);
      std::operator+(&name_1,"Renderbuffer",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info);
      std::__cxx11::string::~string((string *)&info);
      de::toString<int>((string *)&info,&local_694);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vertexAttribs,"Compare renderbuffer ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info);
      std::__cxx11::string::~string((string *)&info);
      local_3b0 = (TextureFormat)s.m_log;
      tcu::getTextureFormatBitDepth((tcu *)&program_1,&format);
      tcu::getTextureFormatBitDepth((tcu *)&primitives,&local_3b0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&threshold_1,3.0);
      tcu::Vector<unsigned_long,_4>::Vector((Vector<unsigned_long,_4> *)&fragmentShader,1);
      tcu::min<int,4>((tcu *)&renderer,(Vector<int,_4> *)&program_1,(Vector<int,_4> *)&primitives);
      tcu::Vector<int,_4>::cast<unsigned_long>
                ((Vector<unsigned_long,_4> *)&drawBuffersSection,(Vector<int,_4> *)&renderer);
      tcu::operator<<((Vector<unsigned_long,_4> *)&renderState,
                      (Vector<unsigned_long,_4> *)&fragmentShader,
                      (Vector<unsigned_long,_4> *)&drawBuffersSection);
      tcu::Vector<unsigned_long,_4>::Vector((Vector<unsigned_long,_4> *)&drawBufferSection,1);
      tcu::operator-((Vector<unsigned_long,_4> *)&info,(Vector<unsigned_long,_4> *)&renderState,
                     (Vector<unsigned_long,_4> *)&drawBufferSection);
      tcu::Vector<unsigned_long,_4>::cast<float>((Vector<unsigned_long,_4> *)&size);
      tcu::operator/((tcu *)&threshold,(Vector<float,_4> *)&threshold_1,(Vector<float,_4> *)&size);
      imageSetDesc = vertexAttribs[0]._0_8_;
      imageSetName = name_1._M_dataplus;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&info,pTVar32);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&renderState,(TextureLevel *)&s);
      bVar10 = tcu::floatThresholdCompare
                         (local_680,imageSetName._M_p,(char *)imageSetDesc,
                          (ConstPixelBufferAccess *)&info,(ConstPixelBufferAccess *)&renderState,
                          &threshold,COMPARE_LOG_RESULT);
      if (!bVar10) {
        de::toString<int>((string *)&fragmentShader,&local_694);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &renderState,"Verification of renderbuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fragmentShader);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &renderState," failed.");
        tcu::ResultCollector::fail(results,(string *)&info);
        std::__cxx11::string::~string((string *)&info);
        std::__cxx11::string::~string((string *)&renderState);
        std::__cxx11::string::~string((string *)&fragmentShader);
      }
      std::__cxx11::string::~string((string *)vertexAttribs);
      this_01 = (FragmentShader *)&name_1;
LAB_013a59d7:
      std::__cxx11::string::~string((string *)this_01);
    }
    else {
      if (TVar14 - TEXTURECHANNELCLASS_SIGNED_INTEGER < 2) {
        de::toString<int>((string *)&info,&local_694);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fragmentShader,"Renderbuffer",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info);
        std::__cxx11::string::~string((string *)&info);
        de::toString<int>((string *)&info,&local_694);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &drawBuffersSection,"Compare renderbuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info);
        std::__cxx11::string::~string((string *)&info);
        pp_Var9 = fragmentShader.super_FragmentShader._vptr_FragmentShader;
        SVar8 = drawBuffersSection;
        name_1._M_dataplus._M_p = &DAT_100000001;
        name_1._M_string_length = (size_type)&DAT_100000001;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&info,pTVar32)
        ;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&renderState,(TextureLevel *)&s);
        bVar10 = tcu::intThresholdCompare
                           (local_680,(char *)pp_Var9,(char *)SVar8.m_log,
                            (ConstPixelBufferAccess *)&info,(ConstPixelBufferAccess *)&renderState,
                            (UVec4 *)&name_1,COMPARE_LOG_RESULT);
        if (!bVar10) {
          de::toString<int>((string *)&drawBufferSection,&local_694);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &renderState,"Verification of renderbuffer ",(string *)&drawBufferSection);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &renderState," failed.");
          tcu::ResultCollector::fail(results,(string *)&info);
LAB_013a59a5:
          std::__cxx11::string::~string((string *)&info);
          std::__cxx11::string::~string((string *)&renderState);
          std::__cxx11::string::~string((string *)&drawBufferSection);
        }
LAB_013a59c2:
        std::__cxx11::string::~string((string *)&drawBuffersSection);
        this_01 = &fragmentShader;
        goto LAB_013a59d7;
      }
      if (TVar14 == TEXTURECHANNELCLASS_FLOATING_POINT) {
        de::toString<int>((string *)&info,&local_694);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fragmentShader,"Renderbuffer",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info);
        std::__cxx11::string::~string((string *)&info);
        de::toString<int>((string *)&info,&local_694);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &drawBuffersSection,"Compare renderbuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info);
        std::__cxx11::string::~string((string *)&info);
        size.m_data = (int  [2])s.m_log;
        tcu::getTextureFormatMantissaBitDepth((tcu *)&info,&format);
        tcu::getTextureFormatMantissaBitDepth((tcu *)&renderState,(TextureFormat *)&size);
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&drawBufferSection,0);
        for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
          iVar11 = *(int *)((long)renderState.fragOps.stencilStates + lVar34 * 4 + -0x30);
          fVar41 = info.valueMin.m_data[lVar34];
          if ((int)fVar41 <= iVar11) {
            *(int *)((long)&drawBufferSection.m_log + lVar34 * 4) = iVar11 - (int)fVar41;
          }
        }
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&name_1,4);
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&program_1,1);
        tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&primitives);
        tcu::operator<<((tcu *)vertexAttribs,(Vector<unsigned_int,_4> *)&program_1,
                        (Vector<unsigned_int,_4> *)&primitives);
        tcu::operator*((tcu *)&threshold_1,(Vector<unsigned_int,_4> *)&name_1,
                       (Vector<unsigned_int,_4> *)vertexAttribs);
        pp_Var9 = fragmentShader.super_FragmentShader._vptr_FragmentShader;
        SVar8 = drawBuffersSection;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&info,pTVar32)
        ;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&renderState,(TextureLevel *)&s);
        bVar10 = tcu::floatUlpThresholdCompare
                           (local_680,(char *)pp_Var9,(char *)SVar8.m_log,
                            (ConstPixelBufferAccess *)&info,(ConstPixelBufferAccess *)&renderState,
                            &threshold_1,COMPARE_LOG_RESULT);
        if (!bVar10) {
          de::toString<int>((string *)&drawBufferSection,&local_694);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &renderState,"Verification of renderbuffer ",(string *)&drawBufferSection);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &renderState," failed.");
          tcu::ResultCollector::fail(results,(string *)&info);
          goto LAB_013a59a5;
        }
        goto LAB_013a59c2;
      }
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&s);
    pvVar25 = (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *)((long)&(local_690->
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

void runTest (TestLog&						log,
			  tcu::ResultCollector&			results,
			  glu::RenderContext&			renderContext,

			  const BlendState&				preCommonBlendState,
			  const BlendState&				postCommonBlendState,
			  const vector<DrawBufferInfo>&	drawBuffers)
{
	const glw::Functions&	gl					= renderContext.getFunctions();
	glu::RenderbufferVector	renderbuffers		(gl, drawBuffers.size());
	glu::Framebuffer		framebuffer			(gl);
	vector<TextureLevel>	refRenderbuffers	(drawBuffers.size());

	logTestCaseInfo(log, preCommonBlendState, postCommonBlendState, drawBuffers);

	genRenderbuffers(gl, drawBuffers, framebuffer, renderbuffers, refRenderbuffers);

	renderQuad(log, renderContext, preCommonBlendState, postCommonBlendState, drawBuffers, framebuffer, refRenderbuffers);

	verifyRenderbuffers(log, results, renderContext, renderbuffers, framebuffer, refRenderbuffers);
}